

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::Shader::~Shader(Shader *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_0012e838;
  (this->infoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0012e800;
  pcVar1 = (this->infoLog).log._M_dataplus._M_p;
  paVar2 = &(this->infoLog).log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->source).super_Item._vptr_Item = (_func_int **)&PTR__ShaderSource_0012e870;
  pcVar1 = (this->source).source._M_dataplus._M_p;
  paVar2 = &(this->source).source.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Shader				(void) {}